

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O0

int i2d_PKCS8PrivateKeyInfo_bio(BIO *bp,EVP_PKEY *key)

{
  PKCS8_PRIV_KEY_INFO *p8inf_00;
  int ret;
  PKCS8_PRIV_KEY_INFO *p8inf;
  EVP_PKEY *key_local;
  BIO *bp_local;
  
  p8inf_00 = EVP_PKEY2PKCS8(key);
  if (p8inf_00 == (PKCS8_PRIV_KEY_INFO *)0x0) {
    bp_local._4_4_ = 0;
  }
  else {
    bp_local._4_4_ = i2d_PKCS8_PRIV_KEY_INFO_bio(bp,p8inf_00);
    PKCS8_PRIV_KEY_INFO_free(p8inf_00);
  }
  return bp_local._4_4_;
}

Assistant:

int i2d_PKCS8PrivateKeyInfo_bio(BIO *bp, EVP_PKEY *key) {
  PKCS8_PRIV_KEY_INFO *p8inf;
  int ret;
  p8inf = EVP_PKEY2PKCS8(key);
  if (!p8inf) {
    return 0;
  }
  ret = i2d_PKCS8_PRIV_KEY_INFO_bio(bp, p8inf);
  PKCS8_PRIV_KEY_INFO_free(p8inf);
  return ret;
}